

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_parser_test.cpp
# Opt level: O0

void __thiscall bioparser::test::BioparserSamTest::Setup(BioparserSamTest *this,string *file)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_20 [16];
  string *file_local;
  BioparserSamTest *this_local;
  
  local_20._8_8_ = file;
  file_local = (string *)this;
  std::operator+(&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/rvaser[P]bioparser/test/data/",
                 file);
  Parser<bioparser::test::SamOverlap>::Create<bioparser::SamParser>
            ((Parser<bioparser::test::SamOverlap> *)local_20,&local_40);
  std::
  unique_ptr<bioparser::Parser<bioparser::test::SamOverlap>,_std::default_delete<bioparser::Parser<bioparser::test::SamOverlap>_>_>
  ::operator=(&this->p,(unique_ptr<bioparser::Parser<bioparser::test::SamOverlap>,_std::default_delete<bioparser::Parser<bioparser::test::SamOverlap>_>_>
                        *)local_20);
  std::
  unique_ptr<bioparser::Parser<bioparser::test::SamOverlap>,_std::default_delete<bioparser::Parser<bioparser::test::SamOverlap>_>_>
  ::~unique_ptr((unique_ptr<bioparser::Parser<bioparser::test::SamOverlap>,_std::default_delete<bioparser::Parser<bioparser::test::SamOverlap>_>_>
                 *)local_20);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void Setup(const std::string& file) {
    p = Parser<SamOverlap>::Create<SamParser>(BIOPARSER_TEST_DATA + file);
  }